

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a70a8::ExpandedSpecialSubstitution::printLeft
          (ExpandedSpecialSubstitution *this,OutputStream *S)

{
  char *pcVar1;
  char *pcVar2;
  StringView R;
  
  switch(*(undefined4 *)&(this->super_Node).field_0xc) {
  case 0:
  case 1:
  case 2:
    pcVar1 = "std::basic_string<char, std::char_traits<char>, std::allocator<char> >";
    pcVar2 = "";
    break;
  case 3:
    pcVar1 = "std::basic_istream<char, std::char_traits<char> >";
    pcVar2 = "";
    break;
  case 4:
    pcVar1 = "std::basic_ostream<char, std::char_traits<char> >";
    pcVar2 = "";
    break;
  case 5:
    pcVar1 = "std::basic_iostream<char, std::char_traits<char> >";
    pcVar2 = "";
    break;
  default:
    return;
  }
  R.Last = pcVar2;
  R.First = pcVar1;
  OutputStream::operator+=(S,R);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      S += "std::basic_string<char, std::char_traits<char>, "
           "std::allocator<char> >";
      break;
    case SpecialSubKind::basic_string:
    case SpecialSubKind::string:
      S += "std::basic_string<char, std::char_traits<char>, "
           "std::allocator<char> >";
      break;
    case SpecialSubKind::istream:
      S += "std::basic_istream<char, std::char_traits<char> >";
      break;
    case SpecialSubKind::ostream:
      S += "std::basic_ostream<char, std::char_traits<char> >";
      break;
    case SpecialSubKind::iostream:
      S += "std::basic_iostream<char, std::char_traits<char> >";
      break;
    }
  }